

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  slot_type *psVar1;
  ctrl_t *p;
  size_t capacity;
  undefined1 auVar2 [16];
  int iVar3;
  undefined4 uVar4;
  slot_type *psVar5;
  size_t sVar6;
  FindInfo FVar7;
  Layout LVar8;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    psVar5 = this->slots_;
    capacity = this->capacity_;
    initialize_slots(this,new_capacity);
    this->capacity_ = new_capacity;
    if (capacity != 0) {
      sVar6 = 0;
      do {
        if (-1 < p[sVar6]) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = (psVar5->value).first;
          hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                    SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
          FVar7 = find_first_non_full(this,hashval);
          set_ctrl(this,FVar7.offset,(byte)hashval & 0x7f);
          iVar3 = *(int *)((long)psVar5 + 8);
          uVar4 = *(undefined4 *)((long)psVar5 + 0xc);
          psVar1 = this->slots_ + FVar7.offset;
          (psVar1->value).first = (psVar5->value).first;
          *(int *)((long)psVar1 + 8) = iVar3;
          *(undefined4 *)((long)psVar1 + 0xc) = uVar4;
        }
        sVar6 = sVar6 + 1;
        psVar5 = psVar5 + 1;
      } while (capacity != sVar6);
      LVar8 = MakeLayout(capacity);
      Deallocate<8ul,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
                ((Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_> *)
                 &this->settings_,p,
                 LVar8.
                 super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<phmap::priv::hash_internal::EnumClass,_int>_>
                 .size_[1] * 0x10 +
                 (LVar8.
                  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<phmap::priv::hash_internal::EnumClass,_int>_>
                  .size_[0] + 7 & 0xfffffffffffffff8));
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::EnumClass, int>>>::resize(size_t) [Policy = phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::EnumClass, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::hash_internal::EnumClass, int>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }